

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprMightBeIndexed2(SrcList *pFrom,int *aiCurCol,Expr *pExpr,int j)

{
  int iVar1;
  int in_ECX;
  Expr *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int iCur;
  int i;
  Index *pIdx;
  int iVar2;
  int iVar3;
  Parse *pParse;
  undefined4 in_stack_ffffffffffffffd8;
  
  do {
    iVar2 = in_RDI[(long)in_ECX * 0x12 + 9];
    for (pParse = *(Parse **)(*(long *)(in_RDI + (long)in_ECX * 0x12 + 6) + 0x10);
        pParse != (Parse *)0x0; pParse = *(Parse **)&pParse->mSubrtnSig) {
      if (pParse->aLabel != (int *)0x0) {
        for (iVar3 = 0; iVar3 < (int)(uint)*(ushort *)((long)&pParse->pConstExpr + 6);
            iVar3 = iVar3 + 1) {
          if (((*(short *)(pParse->zErrMsg + (long)iVar3 * 2) == -2) &&
              (iVar1 = sqlite3ExprCompareSkip
                                 (in_RDX,(Expr *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                  (int)((ulong)pParse >> 0x20)), iVar1 == 0)) &&
             (iVar1 = sqlite3ExprIsConstant(pParse,(Expr *)CONCAT44(iVar3,iVar2)), iVar1 == 0)) {
            *in_RSI = iVar2;
            in_RSI[1] = -2;
            return 1;
          }
        }
      }
    }
    in_ECX = in_ECX + 1;
    if (*in_RDI <= in_ECX) {
      return 0;
    }
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr,           /* An operand of a comparison operator */
  int j                  /* Start looking with the j-th pFrom entry */
){
  Index *pIdx;
  int i;
  int iCur;
  do{
    iCur = pFrom->a[j].iCursor;
    for(pIdx=pFrom->a[j].pSTab->pIndex; pIdx; pIdx=pIdx->pNext){
      if( pIdx->aColExpr==0 ) continue;
      for(i=0; i<pIdx->nKeyCol; i++){
        if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
        assert( pIdx->bHasExpr );
        if( sqlite3ExprCompareSkip(pExpr,pIdx->aColExpr->a[i].pExpr,iCur)==0
         && !sqlite3ExprIsConstant(0,pIdx->aColExpr->a[i].pExpr)
        ){
          aiCurCol[0] = iCur;
          aiCurCol[1] = XN_EXPR;
          return 1;
        }
      }
    }
  }while( ++j < pFrom->nSrc );
  return 0;
}